

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryReader::readTypes(WasmBinaryReader *this)

{
  uint uVar1;
  Module *pMVar2;
  bool bVar3;
  uint32_t uVar4;
  size_t sVar5;
  ulong uVar6;
  Fatal *pFVar7;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  size_type sVar8;
  reference pvVar9;
  reference __in;
  type *ptVar10;
  type *this_00;
  ostream *poVar11;
  mapped_type *pmVar12;
  reference ppVar13;
  type *ptVar14;
  type *ptVar15;
  Struct *this_01;
  char *pcVar16;
  mapped_type *this_02;
  Name name_00;
  Name name_01;
  optional<wasm::HeapType> other;
  optional<wasm::HeapType> other_00;
  optional<wasm::HeapType> other_01;
  Entry EVar17;
  Signature SVar18;
  Field element;
  type *name_1;
  type *field;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false> local_618;
  iterator __end2;
  iterator __begin2;
  type *__range2;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *names;
  type *fields;
  type *index_1;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>_>,_false>
  local_5e0;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>_>_>_>
  *__range1_1;
  type *name;
  type *index;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false> local_598;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *__range1;
  pair<const_wasm::HeapType,_unsigned_int> local_570;
  uint local_55c;
  undefined1 local_558 [4];
  Index i_1;
  Error *local_3d0;
  Error *err;
  BuildResult result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  Entry local_368;
  Field local_358;
  Array local_348;
  Entry local_338;
  Struct local_328;
  Entry local_310;
  HeapType local_300;
  Entry local_2f8;
  Signature local_2e8;
  Entry local_2d8;
  undefined1 local_2c8 [12];
  Entry local_2b8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  uint local_264;
  undefined1 auStack_260 [4];
  uint32_t descIdx_1;
  size_t local_258;
  undefined1 local_250 [12];
  Entry local_240;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  uint local_1ec;
  undefined1 auStack_1e8 [4];
  uint32_t descIdx;
  size_t local_1e0;
  Entry local_1d8;
  undefined1 local_1c8 [12];
  Entry local_1b8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  uint local_164;
  undefined1 local_160 [4];
  uint32_t superIdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  uint32_t local_fc;
  undefined1 auStack_f8 [4];
  uint32_t supers;
  size_t local_f0;
  allocator<char> local_e1;
  string local_e0;
  uint32_t local_bc;
  byte local_b5;
  uint32_t groupSize;
  uint8_t form;
  ulong local_a8;
  size_t i;
  anon_class_16_2_4a87fb1c readStructDef;
  anon_class_24_3_948d3139 readFieldDef;
  anon_class_8_1_8991fb9c readMutability;
  anon_class_8_1_887420fa readContinuationDef;
  anon_class_24_3_6c30d0b0 readSignatureDef;
  anon_class_16_2_f7b3316f readType;
  anon_class_24_3_475464a4 makeType;
  anon_class_16_2_dbef1248 readHeapType;
  TypeBuilder builder;
  WasmBinaryReader *this_local;
  
  uVar4 = getU32LEB(this);
  TypeBuilder::TypeBuilder((TypeBuilder *)&readHeapType.builder,(ulong)uVar4);
  readHeapType.this = (WasmBinaryReader *)&readHeapType.builder;
  makeType.this = (WasmBinaryReader *)&makeType.builder;
  makeType.readHeapType = (anon_class_16_2_dbef1248 *)&readHeapType.builder;
  readSignatureDef.builder = (TypeBuilder *)&readType.this;
  readSignatureDef.this = (WasmBinaryReader *)&readSignatureDef.builder;
  readSignatureDef.readType = (anon_class_16_2_f7b3316f *)&readHeapType.builder;
  readMutability.this = (WasmBinaryReader *)&makeType.builder;
  readFieldDef.this = (WasmBinaryReader *)&readFieldDef.makeType;
  readFieldDef.readMutability = (anon_class_8_1_8991fb9c *)&readType.this;
  readStructDef.this = (WasmBinaryReader *)&readStructDef.readFieldDef;
  local_a8 = 0;
  i = (size_t)this;
  readStructDef.readFieldDef = (anon_class_24_3_948d3139 *)this;
  readFieldDef.makeType = (anon_class_24_3_475464a4 *)this;
  readContinuationDef.readHeapType = (anon_class_16_2_dbef1248 *)this;
  readType.makeType = (anon_class_24_3_475464a4 *)this;
  readType.this = this;
  makeType.builder = (TypeBuilder *)this;
  do {
    uVar6 = local_a8;
    sVar5 = TypeBuilder::size((TypeBuilder *)&readHeapType.builder);
    if (sVar5 <= uVar6) {
      TypeBuilder::build((BuildResult *)&err,(TypeBuilder *)&readHeapType.builder);
      local_3d0 = TypeBuilder::BuildResult::getError((BuildResult *)&err);
      if (local_3d0 == (Error *)0x0) {
        __x = TypeBuilder::BuildResult::operator*((BuildResult *)&err);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator=(&this->types,__x);
        local_55c = 0;
        while( true ) {
          uVar6 = (ulong)local_55c;
          sVar8 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types);
          if (sVar8 <= uVar6) break;
          pMVar2 = this->wasm;
          pvVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                             (&this->types,(ulong)local_55c);
          std::pair<const_wasm::HeapType,_unsigned_int>::
          pair<wasm::HeapType_&,_unsigned_int_&,_true>(&local_570,pvVar9,&local_55c);
          std::
          unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
          ::insert(&pMVar2->typeIndices,&local_570);
          local_55c = local_55c + 1;
        }
        __end1 = std::
                 unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                 ::begin(&this->typeNames);
        local_598._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
             ::end(&this->typeNames);
        while( true ) {
          bVar3 = std::__detail::operator!=
                            (&__end1.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false>
                             ,&local_598);
          if (!bVar3) break;
          ppVar13 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>::
                    operator*(&__end1);
          ptVar14 = std::get<0ul,unsigned_int_const,wasm::Name>(ppVar13);
          ptVar15 = std::get<1ul,unsigned_int_const,wasm::Name>(ppVar13);
          uVar1 = *ptVar14;
          pcVar16 = (char *)std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                                      (&this->types);
          if ((char *)(ulong)uVar1 < pcVar16) {
            pMVar2 = this->wasm;
            pvVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                               (&this->types,(ulong)*ptVar14);
            pmVar12 = std::
                      unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                      ::operator[](&pMVar2->typeNames,pvVar9);
            wasm::Name::operator=(&pmVar12->name,ptVar15);
          }
          else {
            poVar11 = std::operator<<((ostream *)&std::cerr,
                                      "warning: type index out of bounds in name section: ");
            name_00.super_IString.str._M_str = pcVar16;
            name_00.super_IString.str._M_len = (size_t)(ptVar15->super_IString).str._M_str;
            poVar11 = wasm::operator<<((wasm *)poVar11,
                                       (ostream *)(ptVar15->super_IString).str._M_len,name_00);
            poVar11 = std::operator<<(poVar11," at index ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,*ptVar14);
            std::operator<<(poVar11,'\n');
          }
          std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>::
          operator++(&__end1);
        }
        __end1_1 = std::
                   unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>_>_>_>
                   ::begin(&this->fieldNames);
        local_5e0._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>_>_>_>
             ::end(&this->fieldNames);
        while( true ) {
          bVar3 = std::__detail::operator!=
                            (&__end1_1.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>_>,_false>
                             ,&local_5e0);
          if (!bVar3) break;
          __in = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>_>,_false,_false>
                 ::operator*(&__end1_1);
          ptVar10 = std::
                    get<0ul,unsigned_int_const,std::unordered_map<unsigned_int,wasm::Name,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>>>
                              (__in);
          this_00 = std::
                    get<1ul,unsigned_int_const,std::unordered_map<unsigned_int,wasm::Name,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>>>
                              (__in);
          uVar1 = *ptVar10;
          sVar8 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types);
          if (uVar1 < sVar8) {
            pvVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                               (&this->types,(ulong)*ptVar10);
            bVar3 = HeapType::isStruct(pvVar9);
            if (bVar3) {
              pMVar2 = this->wasm;
              pvVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                                 (&this->types,(ulong)*ptVar10);
              pmVar12 = std::
                        unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
                        ::operator[](&pMVar2->typeNames,pvVar9);
              __end2 = std::
                       unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                       ::begin(this_00);
              local_618._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                   ::end(this_00);
              while( true ) {
                bVar3 = std::__detail::operator!=
                                  (&__end2.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false>
                                   ,&local_618);
                if (!bVar3) break;
                ppVar13 = std::__detail::
                          _Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>::
                          operator*(&__end2);
                ptVar14 = std::get<0ul,unsigned_int_const,wasm::Name>(ppVar13);
                ptVar15 = std::get<1ul,unsigned_int_const,wasm::Name>(ppVar13);
                uVar1 = *ptVar14;
                pvVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                                   (&this->types,(ulong)*ptVar10);
                this_01 = HeapType::getStruct(pvVar9);
                pcVar16 = (char *)std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size
                                            (&this_01->fields);
                if ((char *)(ulong)uVar1 < pcVar16) {
                  this_02 = std::
                            unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                            ::operator[](&pmVar12->fieldNames,ptVar14);
                  wasm::Name::operator=(this_02,ptVar15);
                }
                else {
                  poVar11 = std::operator<<((ostream *)&std::cerr,
                                            "warning: field index out of bounds in name section: ");
                  name_01.super_IString.str._M_str = pcVar16;
                  name_01.super_IString.str._M_len = (size_t)(ptVar15->super_IString).str._M_str;
                  poVar11 = wasm::operator<<((wasm *)poVar11,
                                             (ostream *)(ptVar15->super_IString).str._M_len,name_01)
                  ;
                  poVar11 = std::operator<<(poVar11," at index ");
                  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*ptVar14);
                  poVar11 = std::operator<<(poVar11," in type ");
                  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*ptVar10);
                  std::operator<<(poVar11,'\n');
                }
                std::__detail::
                _Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>::operator++
                          (&__end2);
              }
            }
            else {
              poVar11 = std::operator<<((ostream *)&std::cerr,
                                        "warning: field names applied to non-struct type at index ")
              ;
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,*ptVar10);
              std::operator<<(poVar11,'\n');
            }
          }
          else {
            poVar11 = std::operator<<((ostream *)&std::cerr,
                                      "warning: type index out of bounds in name section: fields at index "
                                     );
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,*ptVar10);
            std::operator<<(poVar11,'\n');
          }
          std::__detail::
          _Node_iterator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>_>,_false,_false>
          ::operator++(&__end1_1);
        }
        TypeBuilder::BuildResult::~BuildResult((BuildResult *)&err);
        TypeBuilder::~TypeBuilder((TypeBuilder *)&readHeapType.builder);
        return;
      }
      Fatal::Fatal((Fatal *)local_558);
      pFVar7 = Fatal::operator<<((Fatal *)local_558,(char (*) [15])"Invalid type: ");
      pFVar7 = Fatal::operator<<(pFVar7,&local_3d0->reason);
      pFVar7 = Fatal::operator<<(pFVar7,(char (*) [11])0x294b9d1);
      Fatal::operator<<(pFVar7,&local_3d0->index);
      Fatal::~Fatal((Fatal *)local_558);
    }
    local_b5 = getInt8(this);
    if (local_b5 == 0x4e) {
      local_bc = getU32LEB(this);
      if (local_bc == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"Recursion groups of size zero not supported",&local_e1);
        throwError(this,&local_e0);
      }
      TypeBuilder::grow((TypeBuilder *)&readHeapType.builder,(ulong)(local_bc - 1));
      TypeBuilder::createRecGroup((TypeBuilder *)&readHeapType.builder,local_a8,(ulong)local_bc);
      local_b5 = getInt8(this);
    }
    if ((local_b5 == 0x50) || (local_b5 == 0x4f)) {
      if (local_b5 == 0x50) {
        EVar17 = TypeBuilder::operator[]((TypeBuilder *)&readHeapType.builder,local_a8);
        _auStack_f8 = EVar17;
        TypeBuilder::Entry::setOpen((Entry *)auStack_f8,true);
      }
      local_fc = getU32LEB(this);
      if (local_fc != 0) {
        if (local_fc != 1) {
          std::__cxx11::to_string((string *)local_160,local_fc);
          std::operator+(&local_140,"Invalid type definition with ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160);
          std::operator+(&local_120,&local_140," supertypes");
          throwError(this,&local_120);
        }
        local_164 = getU32LEB(this);
        uVar6 = (ulong)local_164;
        sVar5 = TypeBuilder::size((TypeBuilder *)&readHeapType.builder);
        if (sVar5 <= uVar6) {
          std::__cxx11::to_string(&local_1a8,local_164);
          std::operator+(&local_188,"invalid supertype index: ",&local_1a8);
          throwError(this,&local_188);
        }
        EVar17 = TypeBuilder::operator[]((TypeBuilder *)&readHeapType.builder,local_a8);
        local_1b8 = EVar17;
        EVar17 = TypeBuilder::operator[]((TypeBuilder *)&readHeapType.builder,(ulong)local_164);
        local_1d8 = EVar17;
        std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
                  ((optional<wasm::HeapType> *)local_1c8,&local_1d8);
        other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
        other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload =
             (_Storage<wasm::HeapType,_true>)local_1c8._0_8_;
        other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_1c8[8];
        other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._9_3_ = local_1c8._9_3_;
        TypeBuilder::Entry::subTypeOf(&local_1b8,other);
      }
      local_b5 = getInt8(this);
    }
    if (local_b5 == 0x65) {
      EVar17 = TypeBuilder::operator[]((TypeBuilder *)&readHeapType.builder,local_a8);
      _auStack_1e8 = EVar17;
      TypeBuilder::Entry::setShared((Entry *)auStack_1e8,Shared);
      local_b5 = getInt8(this);
    }
    if (local_b5 == 0x4c) {
      local_1ec = getU32LEB(this);
      uVar6 = (ulong)local_1ec;
      sVar5 = TypeBuilder::size((TypeBuilder *)&readHeapType.builder);
      if (sVar5 <= uVar6) {
        std::__cxx11::to_string(&local_230,local_1ec);
        std::operator+(&local_210,"invalid described type index: ",&local_230);
        throwError(this,&local_210);
      }
      EVar17 = TypeBuilder::operator[]((TypeBuilder *)&readHeapType.builder,local_a8);
      local_240 = EVar17;
      EVar17 = TypeBuilder::operator[]((TypeBuilder *)&readHeapType.builder,(ulong)local_1ec);
      _auStack_260 = EVar17;
      std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
                ((optional<wasm::HeapType> *)local_250,(Entry *)auStack_260);
      other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
      other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)local_250._0_8_;
      other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_250[8];
      other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_3_ = local_250._9_3_;
      TypeBuilder::Entry::describes(&local_240,other_00);
      local_b5 = getInt8(this);
    }
    if (local_b5 == 0x4d) {
      local_264 = getU32LEB(this);
      uVar6 = (ulong)local_264;
      sVar5 = TypeBuilder::size((TypeBuilder *)&readHeapType.builder);
      if (sVar5 <= uVar6) {
        std::__cxx11::to_string(&local_2a8,local_264);
        std::operator+(&local_288,"invalid descriptor type index: ",&local_2a8);
        throwError(this,&local_288);
      }
      EVar17 = TypeBuilder::operator[]((TypeBuilder *)&readHeapType.builder,local_a8);
      local_2b8 = EVar17;
      EVar17 = TypeBuilder::operator[]((TypeBuilder *)&readHeapType.builder,(ulong)local_264);
      local_2d8 = EVar17;
      std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
                ((optional<wasm::HeapType> *)local_2c8,&local_2d8);
      other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
      other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           (_Storage<wasm::HeapType,_true>)local_2c8._0_8_;
      other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_2c8[8];
      other_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_3_ = local_2c8._9_3_;
      TypeBuilder::Entry::descriptor(&local_2b8,other_01);
      local_b5 = getInt8(this);
    }
    if (local_b5 == 0x60) {
      SVar18 = readTypes::anon_class_24_3_6c30d0b0::operator()
                         ((anon_class_24_3_6c30d0b0 *)&readContinuationDef);
      local_2e8 = SVar18;
      EVar17 = TypeBuilder::operator[]((TypeBuilder *)&readHeapType.builder,local_a8);
      local_2f8 = EVar17;
      TypeBuilder::Entry::operator=(&local_2f8,local_2e8);
    }
    else if (local_b5 == 0x5d) {
      local_300.id = (uintptr_t)
                     readTypes::anon_class_8_1_887420fa::operator()
                               ((anon_class_8_1_887420fa *)&readMutability);
      EVar17 = TypeBuilder::operator[]((TypeBuilder *)&readHeapType.builder,local_a8);
      local_310 = EVar17;
      TypeBuilder::Entry::operator=(&local_310,(Continuation)local_300.id);
    }
    else if (local_b5 == 0x5f) {
      readTypes::anon_class_16_2_4a87fb1c::operator()(&local_328,(anon_class_16_2_4a87fb1c *)&i);
      EVar17 = TypeBuilder::operator[]((TypeBuilder *)&readHeapType.builder,local_a8);
      local_338 = EVar17;
      TypeBuilder::Entry::operator=(&local_338,&local_328);
      Struct::~Struct(&local_328);
    }
    else {
      if (local_b5 != 0x5e) {
        std::__cxx11::to_string
                  ((string *)
                   ((long)&result.
                           super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                           .
                           super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                           .
                           super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                   + 0x18),(uint)local_b5);
        std::operator+(&local_388,"Bad type form ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&result.
                               super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                               .
                               super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                               .
                               super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                               .
                               super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                               .
                               super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                               .
                               super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       + 0x18));
        throwError(this,&local_388);
      }
      element = readTypes::anon_class_24_3_948d3139::operator()
                          ((anon_class_24_3_948d3139 *)&readStructDef.readFieldDef);
      local_358 = element;
      Array::Array(&local_348,element);
      EVar17 = TypeBuilder::operator[]((TypeBuilder *)&readHeapType.builder,local_a8);
      local_368 = EVar17;
      TypeBuilder::Entry::operator=(&local_368,&local_348);
    }
    local_a8 = local_a8 + 1;
  } while( true );
}

Assistant:

void WasmBinaryReader::readTypes() {
  TypeBuilder builder(getU32LEB());

  auto readHeapType = [&]() -> std::pair<HeapType, Exactness> {
    int64_t htCode = getS64LEB(); // TODO: Actually s33
    auto exactness = Inexact;
    if (htCode == BinaryConsts::EncodedType::ExactLEB) {
      exactness = Exact;
      htCode = getS64LEB(); // TODO: Actually s33
    }
    if (htCode >= 0) {
      if (size_t(htCode) >= builder.size()) {
        throwError("invalid type index: " + std::to_string(htCode));
      }
      return {builder.getTempHeapType(size_t(htCode)), exactness};
    }
    if (exactness == Exact) {
      throwError("invalid type index: " + std::to_string(htCode));
    }
    auto share = Unshared;
    if (htCode == BinaryConsts::EncodedType::SharedLEB) {
      share = Shared;
      htCode = getS64LEB(); // TODO: Actually s33
    }
    HeapType ht;
    if (getBasicHeapType(htCode, ht)) {
      return {ht.getBasic(share), Inexact};
    }
    throwError("invalid wasm heap type: " + std::to_string(htCode));
  };
  auto makeType = [&](int32_t typeCode) {
    Type type;
    if (getBasicType(typeCode, type)) {
      return type;
    }

    switch (typeCode) {
      case BinaryConsts::EncodedType::nullable:
      case BinaryConsts::EncodedType::nonnullable: {
        auto nullability = typeCode == BinaryConsts::EncodedType::nullable
                             ? Nullable
                             : NonNullable;

        auto [ht, exactness] = readHeapType();
        if (ht.isBasic()) {
          return Type(ht, nullability, exactness);
        }

        return builder.getTempRefType(ht, nullability, exactness);
      }
      default:
        throwError("unexpected type index: " + std::to_string(typeCode));
    }
    WASM_UNREACHABLE("unexpected type");
  };
  auto readType = [&]() { return makeType(getS32LEB()); };

  auto readSignatureDef = [&]() {
    std::vector<Type> params;
    std::vector<Type> results;
    size_t numParams = getU32LEB();
    for (size_t j = 0; j < numParams; j++) {
      params.push_back(readType());
    }
    auto numResults = getU32LEB();
    for (size_t j = 0; j < numResults; j++) {
      results.push_back(readType());
    }
    return Signature(builder.getTempTupleType(params),
                     builder.getTempTupleType(results));
  };

  auto readContinuationDef = [&]() {
    auto [ht, exactness] = readHeapType();
    if (exactness != Inexact) {
      throw ParseException("invalid exact type in cont definition");
    }
    if (!ht.isSignature()) {
      throw ParseException("cont types must be built from function types");
    }
    return Continuation(ht);
  };

  auto readMutability = [&]() {
    switch (getU32LEB()) {
      case 0:
        return Immutable;
      case 1:
        return Mutable;
      default:
        throw ParseException("Expected 0 or 1 for mutability");
    }
  };

  auto readFieldDef = [&]() {
    // The value may be a general wasm type, or one of the types only possible
    // in a field.
    auto typeCode = getS32LEB();
    if (typeCode == BinaryConsts::EncodedType::i8) {
      auto mutable_ = readMutability();
      return Field(Field::i8, mutable_);
    }
    if (typeCode == BinaryConsts::EncodedType::i16) {
      auto mutable_ = readMutability();
      return Field(Field::i16, mutable_);
    }
    // It's a regular wasm value.
    auto type = makeType(typeCode);
    auto mutable_ = readMutability();
    return Field(type, mutable_);
  };

  auto readStructDef = [&]() {
    FieldList fields;
    size_t numFields = getU32LEB();
    for (size_t j = 0; j < numFields; j++) {
      fields.push_back(readFieldDef());
    }
    return Struct(std::move(fields));
  };

  for (size_t i = 0; i < builder.size(); i++) {
    auto form = getInt8();
    if (form == BinaryConsts::EncodedType::Rec) {
      uint32_t groupSize = getU32LEB();
      if (groupSize == 0u) {
        // TODO: Support groups of size zero by shrinking the builder.
        throwError("Recursion groups of size zero not supported");
      }
      // The group counts as one element in the type section, so we have to
      // allocate space for the extra types.
      builder.grow(groupSize - 1);
      builder.createRecGroup(i, groupSize);
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Sub ||
        form == BinaryConsts::EncodedType::SubFinal) {
      if (form == BinaryConsts::EncodedType::Sub) {
        builder[i].setOpen();
      }
      uint32_t supers = getU32LEB();
      if (supers > 0) {
        if (supers != 1) {
          throwError("Invalid type definition with " + std::to_string(supers) +
                     " supertypes");
        }
        auto superIdx = getU32LEB();
        if (superIdx >= builder.size()) {
          throwError("invalid supertype index: " + std::to_string(superIdx));
        }
        builder[i].subTypeOf(builder[superIdx]);
      }
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Shared) {
      builder[i].setShared();
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Describes) {
      auto descIdx = getU32LEB();
      if (descIdx >= builder.size()) {
        throwError("invalid described type index: " + std::to_string(descIdx));
      }
      builder[i].describes(builder[descIdx]);
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Descriptor) {
      auto descIdx = getU32LEB();
      if (descIdx >= builder.size()) {
        throwError("invalid descriptor type index: " + std::to_string(descIdx));
      }
      builder[i].descriptor(builder[descIdx]);
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Func) {
      builder[i] = readSignatureDef();
    } else if (form == BinaryConsts::EncodedType::Cont) {
      builder[i] = readContinuationDef();
    } else if (form == BinaryConsts::EncodedType::Struct) {
      builder[i] = readStructDef();
    } else if (form == BinaryConsts::EncodedType::Array) {
      builder[i] = Array(readFieldDef());
    } else {
      throwError("Bad type form " + std::to_string(form));
    }
  }

  auto result = builder.build();
  if (auto* err = result.getError()) {
    Fatal() << "Invalid type: " << err->reason << " at index " << err->index;
  }
  types = std::move(*result);

  // Record the type indices.
  for (Index i = 0; i < types.size(); ++i) {
    wasm.typeIndices.insert({types[i], i});
  }

  // Assign names from the names section.
  for (auto& [index, name] : typeNames) {
    if (index >= types.size()) {
      std::cerr << "warning: type index out of bounds in name section: " << name
                << " at index " << index << '\n';
      continue;
    }
    wasm.typeNames[types[index]].name = name;
  }
  for (auto& [index, fields] : fieldNames) {
    if (index >= types.size()) {
      std::cerr
        << "warning: type index out of bounds in name section: fields at index "
        << index << '\n';
      continue;
    }
    if (!types[index].isStruct()) {
      std::cerr << "warning: field names applied to non-struct type at index "
                << index << '\n';
      continue;
    }
    auto& names = wasm.typeNames[types[index]].fieldNames;
    for (auto& [field, name] : fields) {
      if (field >= types[index].getStruct().fields.size()) {
        std::cerr << "warning: field index out of bounds in name section: "
                  << name << " at index " << field << " in type " << index
                  << '\n';
        continue;
      }
      names[field] = name;
    }
  }
}